

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * ImGui::ParseFormatTrimDecorationsLeading(char *fmt)

{
  char cVar1;
  char *pcStack_18;
  char c;
  char *fmt_local;
  
  for (pcStack_18 = fmt;
      (cVar1 = *pcStack_18, cVar1 != '\0' && ((cVar1 != '%' || (pcStack_18[1] == '%'))));
      pcStack_18 = pcStack_18 + 1) {
    if (cVar1 == '%') {
      pcStack_18 = pcStack_18 + 1;
    }
  }
  return pcStack_18;
}

Assistant:

const char* ImGui::ParseFormatTrimDecorationsLeading(const char* fmt)
{
    while (char c = fmt[0])
    {
        if (c == '%' && fmt[1] != '%')
            return fmt;
        else if (c == '%')
            fmt++;
        fmt++;
    }
    return fmt;
}